

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqdebug.cpp
# Opt level: O1

void __thiscall SQVM::Raise_Error(SQVM *this,SQObjectPtr *desc)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  SQTable *pSVar4;
  
  SVar2 = (this->_lasterror).super_SQObject._type;
  pSVar4 = (this->_lasterror).super_SQObject._unVal.pTable;
  (this->_lasterror).super_SQObject._unVal = (desc->super_SQObject)._unVal;
  SVar3 = (desc->super_SQObject)._type;
  (this->_lasterror).super_SQObject._type = SVar3;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(((this->_lasterror).super_SQObject._unVal.pTable)->super_SQDelegable).
              super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
      return;
    }
  }
  return;
}

Assistant:

void SQVM::Raise_Error(const SQObjectPtr &desc)
{
    _lasterror = desc;
}